

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

Vector3d * __thiscall VCClusterQuad::center(VCClusterQuad *this,Matrix4d *E)

{
  ulong uVar1;
  undefined8 in_RDX;
  long in_RSI;
  VCCluster *in_RDI;
  Vector3d x;
  VCCluster *this_00;
  undefined1 local_30 [24];
  undefined8 local_18;
  VCCluster *this_01;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  this_01 = in_RDI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x27eff3);
  uVar1 = (*(code *)**(undefined8 **)(in_RSI + 0xf0))(in_RSI + 0xf0,local_18,local_30);
  if ((uVar1 & 1) == 0) {
    VCCluster::center(this_01);
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,(Matrix<double,_3,_1,_0,_3,_1> *)in_RDI);
  }
  return (Vector3d *)this_00;
}

Assistant:

Vector3d VCClusterQuad::center(const Matrix4d& E) {
	Vector3d x;
	if (solveQuadMetric(E, x))
		return x;
	return VCCluster::center();
}